

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O1

void adjust_grid(void)

{
  Vertex *pVVar1;
  double (*padVar2) [50];
  long lVar3;
  long lVar4;
  double *pdVar5;
  
  pVVar1 = vertex;
  padVar2 = p;
  lVar3 = 0;
  do {
    lVar4 = 8;
    pdVar5 = *padVar2;
    do {
      *(float *)((long)&pVVar1->x + lVar4) = (float)(*pdVar5 * 0.02);
      lVar4 = lVar4 + 0x18;
      pdVar5 = pdVar5 + 0x32;
    } while (lVar4 != 0x4b8);
    lVar3 = lVar3 + 1;
    pVVar1 = pVVar1 + 0x32;
    padVar2 = (double (*) [50])((long)padVar2 + 8);
  } while (lVar3 != 0x32);
  return;
}

Assistant:

void adjust_grid(void)
{
    int pos;
    int x, y;

    for (y = 0; y < GRIDH;  y++)
    {
        for (x = 0;  x < GRIDW;  x++)
        {
            pos = y * GRIDW + x;
            vertex[pos].z = (float) (p[x][y] * (1.0 / 50.0));
        }
    }
}